

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  UnitTestImpl *pUVar1;
  TestPartResultReporterInterface *pTVar2;
  HasNewFatalFailureHelper *this_local;
  
  TestPartResultReporterInterface::TestPartResultReporterInterface
            (&this->super_TestPartResultReporterInterface);
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00285c98;
  this->has_new_fatal_failure_ = false;
  pUVar1 = GetUnitTestImpl();
  pTVar2 = UnitTestImpl::GetTestPartResultReporterForCurrentThread(pUVar1);
  this->original_reporter_ = pTVar2;
  pUVar1 = GetUnitTestImpl();
  UnitTestImpl::SetTestPartResultReporterForCurrentThread
            (pUVar1,&this->super_TestPartResultReporterInterface);
  return;
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(
          GetUnitTestImpl()->GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}